

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_impl.hpp
# Opt level: O1

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  ~TestCaseStats(this);
  operator_delete(this,400);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() {}